

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_FraigSimulateOneSim(Ivy_FraigMan_t *p)

{
  Ivy_FraigSim_t *pSims;
  abctime aVar1;
  abctime aVar2;
  Ivy_FraigSim_t **ppIVar3;
  
  aVar1 = Abc_Clock();
  ppIVar3 = &p->pSimStart;
  while (pSims = *ppIVar3, pSims != (Ivy_FraigSim_t *)0x0) {
    Ivy_NodeSimulateSim(p,pSims);
    ppIVar3 = &pSims->pNext;
  }
  aVar2 = Abc_Clock();
  p->timeSim = p->timeSim + (aVar2 - aVar1);
  p->nSimRounds = p->nSimRounds + 1;
  return;
}

Assistant:

void Ivy_FraigSimulateOneSim( Ivy_FraigMan_t * p )
{
    Ivy_FraigSim_t * pSims;
    abctime clk;
clk = Abc_Clock();
    for ( pSims = p->pSimStart; pSims; pSims = pSims->pNext )
        Ivy_NodeSimulateSim( p, pSims );
p->timeSim += Abc_Clock() - clk;
p->nSimRounds++;
}